

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O2

int cmd_feature(char *arg)

{
  FILE *__stream;
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined8 *__ptr;
  char *pcVar5;
  undefined8 *puVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  undefined8 *__ptr_00;
  int *piVar10;
  ulong uVar11;
  size_t sVar12;
  size_t sStack_50;
  void *local_48;
  uint8_t *states;
  int iStack_38;
  int option_index;
  
  __ptr = (undefined8 *)malloc(0x10);
  pcVar5 = strdup(arg);
  *__ptr = pcVar5;
  strtok(pcVar5," ");
  iVar3 = -1;
  sVar12 = 0x18;
  while (pcVar5 = strtok((char *)0x0," "), pcVar5 != (char *)0x0) {
    puVar6 = (undefined8 *)realloc(__ptr,sVar12);
    __stream = _stderr;
    if (puVar6 == (undefined8 *)0x0) {
      iVar3 = 1;
      piVar10 = __errno_location();
      pcVar5 = strerror(*piVar10);
      fprintf(__stream,"Memory allocation failed (%s:%d, %s)",
              "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/tools/lint/commands.c"
              ,0x4a5,pcVar5);
      goto LAB_00108f64;
    }
    *(char **)((long)puVar6 + (sVar12 - 0x10)) = pcVar5;
    iVar3 = iVar3 + -1;
    sVar12 = sVar12 + 8;
    __ptr = puVar6;
  }
  __ptr[(uint)-iVar3] = 0;
  _optind = 0;
  _iStack_38 = 0;
  pcVar5 = (char *)0x0;
  uVar1 = _iStack_38;
  do {
    while( true ) {
      _iStack_38 = uVar1;
      states._4_4_ = 0;
      iVar2 = getopt_long(-iVar3,__ptr,"he:d:",cmd_feature::long_options,(long)&states + 4);
      if (iVar2 == -1) {
        if (iVar3 + _optind == 0) {
          pcVar5 = "Missing the module name.\n";
          sStack_50 = 0x19;
          goto LAB_00108f57;
        }
        pcVar9 = (char *)__ptr[_optind];
        pcVar7 = strchr(pcVar9,0x40);
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          *pcVar7 = '\0';
          pcVar7 = pcVar7 + 1;
        }
        lVar8 = ly_ctx_get_module(ctx,pcVar9,pcVar7,0);
        if ((lVar8 != 0) || (lVar8 = ly_ctx_get_submodule(ctx,0,0,pcVar9,pcVar7), lVar8 != 0)) {
          if (iStack_38 == 0) {
            uVar11 = 0;
            printf("%s features:\n",*(undefined8 *)(lVar8 + 8));
            __ptr_00 = (undefined8 *)lys_features_list(lVar8,&local_48);
            puVar6 = __ptr_00;
            while( true ) {
              if ((char *)*puVar6 == (char *)0x0) break;
              sVar12 = strlen((char *)*puVar6);
              uVar4 = (uint)sVar12;
              if (sVar12 <= uVar11) {
                uVar4 = (uint)uVar11;
              }
              puVar6 = puVar6 + 1;
              uVar11 = (ulong)uVar4;
            }
            for (lVar8 = 0; __ptr_00[lVar8] != 0; lVar8 = lVar8 + 1) {
              pcVar5 = "on";
              if (*(char *)((long)local_48 + lVar8) == '\0') {
                pcVar5 = "off";
              }
              printf("\t%-*s (%s)\n",uVar11,__ptr_00[lVar8],pcVar5);
            }
            free(__ptr_00);
            free(local_48);
            iVar3 = 1;
            if (lVar8 == 0) {
              puts("\t(none)");
            }
            goto LAB_00108f64;
          }
          goto LAB_00108dc9;
        }
        if (pcVar7 == (char *)0x0) {
          fprintf(_stderr,"No (sub)module \"%s\" found.\n",pcVar9);
        }
        else {
          fprintf(_stderr,"No (sub)module \"%s\" in revision %s found.\n",pcVar9,pcVar7);
        }
        goto LAB_00108f60;
      }
      if (iVar2 == 100) break;
      if (iVar2 == 0x65) {
        pcVar5 = _optarg;
        uVar1 = 1;
        if (iStack_38 != 0) {
          pcVar5 = "Only one of enable or disable can be specified.\n";
          sStack_50 = 0x30;
          goto LAB_00108f57;
        }
      }
      else {
        if (iVar2 == 0x68) {
          cmd_feature_help();
          iVar3 = 0;
          goto LAB_00108f64;
        }
        uVar1 = _iStack_38;
        if (iVar2 == 0x3f) {
          fprintf(_stderr,"Unknown option \"%d\".\n",0x3f);
          goto LAB_00108f60;
        }
      }
    }
    pcVar5 = _optarg;
    uVar1 = 2;
  } while (iStack_38 == 0);
  pcVar5 = "Only one of enable, or disable can be specified.\n";
  sStack_50 = 0x31;
LAB_00108f57:
  fwrite(pcVar5,sStack_50,1,_stderr);
LAB_00108f60:
  iVar3 = 1;
LAB_00108f64:
  free((void *)*__ptr);
  free(__ptr);
  return iVar3;
LAB_00108dc9:
  pcVar9 = strtok(pcVar5,",");
  if (pcVar9 != (char *)0x0) {
    if ((int)_iStack_38 != 2) goto code_r0x00108de9;
    iVar3 = lys_features_disable(lVar8,pcVar9);
    goto LAB_00108e0c;
  }
  goto LAB_00108f60;
code_r0x00108de9:
  pcVar5 = (char *)0x0;
  if ((int)_iStack_38 == 1) {
    iVar3 = lys_features_enable(lVar8,pcVar9);
LAB_00108e0c:
    pcVar5 = (char *)0x0;
    if (iVar3 != 0) {
      fprintf(_stderr,"Feature \"%s\" not found.\n",pcVar9);
      pcVar5 = (char *)0x0;
    }
  }
  goto LAB_00108dc9;
}

Assistant:

int
cmd_feature(const char *arg)
{
    int c, i, argc, option_index, ret = 1, task = 0;
    unsigned int max_len;
    char **argv = NULL, *ptr, *model_name, *revision, *feat_names = NULL;
    const char **names;
    uint8_t *states;
    const struct lys_module *module;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"enable", required_argument, 0, 'e'},
        {"disable", required_argument, 0, 'd'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc + 2) * sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto cleanup;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "he:d:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_feature_help();
            ret = 0;
            goto cleanup;
        case 'e':
            if (task) {
                fprintf(stderr, "Only one of enable or disable can be specified.\n");
                goto cleanup;
            }
            task = 1;
            feat_names = optarg;
            break;
        case 'd':
            if (task) {
                fprintf(stderr, "Only one of enable, or disable can be specified.\n");
                goto cleanup;
            }
            task = 2;
            feat_names = optarg;
            break;
        case '?':
            fprintf(stderr, "Unknown option \"%d\".\n", (char)c);
            goto cleanup;
        }
    }

    /* module name */
    if (optind == argc) {
        fprintf(stderr, "Missing the module name.\n");
        goto cleanup;
    }

    revision = NULL;
    model_name = argv[optind];
    if (strchr(model_name, '@')) {
        revision = strchr(model_name, '@');
        revision[0] = '\0';
        ++revision;
    }

    module = ly_ctx_get_module(ctx, model_name, revision, 0);
    if (!module) {
        /* not a module, try to find it as a submodule */
        module = (const struct lys_module *)ly_ctx_get_submodule(ctx, NULL, NULL, model_name, revision);
    }

    if (module == NULL) {
        if (revision) {
            fprintf(stderr, "No (sub)module \"%s\" in revision %s found.\n", model_name, revision);
        } else {
            fprintf(stderr, "No (sub)module \"%s\" found.\n", model_name);
        }
        goto cleanup;
    }

    if (!task) {
        printf("%s features:\n", module->name);

        names = lys_features_list(module, &states);

        /* get the max len */
        max_len = 0;
        for (i = 0; names[i]; ++i) {
            if (strlen(names[i]) > max_len) {
                max_len = strlen(names[i]);
            }
        }
        for (i = 0; names[i]; ++i) {
            printf("\t%-*s (%s)\n", max_len, names[i], states[i] ? "on" : "off");
        }
        free(names);
        free(states);
        if (!i) {
            printf("\t(none)\n");
        }
    } else {
        feat_names = strtok(feat_names, ",");
        while (feat_names) {
            if (((task == 1) && lys_features_enable(module, feat_names))
                    || ((task == 2) && lys_features_disable(module, feat_names))) {
                fprintf(stderr, "Feature \"%s\" not found.\n", feat_names);
                ret = 1;
            }
            feat_names = strtok(NULL, ",");
        }
    }

cleanup:
    free(*argv);
    free(argv);

    return ret;
}